

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_InSet_Test::~TApp_InSet_Test(TApp_InSet_Test *this)

{
  TApp_InSet_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, InSet) {

    std::string choice;
    app.add_set("-q,--quick", choice, {"one", "two", "three"});

    args = {"--quick", "two"};

    run();
    EXPECT_EQ("two", choice);

    app.reset();

    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);
}